

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFunctions.h
# Opt level: O0

int luabridge::detail::CFunc::readOnlyError(lua_State *L)

{
  undefined8 L_00;
  int iVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string s;
  lua_State *L_local;
  
  s.field_2._8_8_ = L;
  std::__cxx11::string::string((string *)local_30);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,"\'")
  ;
  pcVar2 = lua_tolstring((lua_State *)s.field_2._8_8_,-0xf4629,(size_t *)0x0);
  std::operator+(&local_70,&local_90,pcVar2);
  std::operator+(&local_50,&local_70,"\' is read-only");
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  L_00 = s.field_2._8_8_;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = luaL_error((lua_State *)L_00,pcVar2);
  std::__cxx11::string::~string((string *)local_30);
  return iVar1;
}

Assistant:

static int readOnlyError(lua_State* L)
    {
        std::string s;

        s = s + "'" + lua_tostring(L, lua_upvalueindex(1)) + "' is read-only";

        return luaL_error(L, s.c_str());
    }